

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

NumericConstant __thiscall
mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
          (BasicExprFactory<std::allocator<char>_> *this,double value)

{
  NumericConstant NVar1;
  
  NVar1.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>)
       Allocate<mp::NumericConstant>(this,FIRST_EXPR,0);
  *(double *)
   ((long)NVar1.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_ + 8) =
       value;
  return (NumericConstant)
         NVar1.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
}

Assistant:

NumericConstant MakeNumericConstant(double value) {
    NumericConstant::Impl *impl = Allocate<NumericConstant>(expr::NUMBER);
    impl->value = value;
    return Expr::Create<NumericConstant>(impl);
  }